

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O0

void __thiscall cmComputeLinkDepends::VisitEntry(cmComputeLinkDepends *this,int index)

{
  bool bVar1;
  bool bVar2;
  uint component_00;
  vector<int,_std::allocator<int>_> *pvVar3;
  uint *puVar4;
  reference __x;
  pointer ppVar5;
  const_iterator __first;
  const_iterator __last;
  size_type sVar6;
  PendingComponent *pPVar7;
  reference this_00;
  __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
  local_88;
  __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
  local_80;
  const_iterator oi;
  EdgeList *ol;
  PendingComponent *pc_1;
  NodeList *nl_1;
  NodeList *nl;
  PendingComponent *pc;
  _Self local_28;
  iterator mi;
  int component;
  bool completed;
  cmComputeLinkDepends *pcStack_10;
  int index_local;
  cmComputeLinkDepends *this_local;
  
  component = index;
  pcStack_10 = this;
  std::vector<int,_std::allocator<int>_>::push_back(&this->FinalLinkOrder,&component);
  bVar2 = false;
  pvVar3 = cmComputeComponentGraph::GetComponentMap(this->CCG);
  puVar4 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](pvVar3,(long)component);
  mi._M_node._4_4_ = *puVar4;
  __x = std::vector<int,_std::allocator<int>_>::operator[]
                  (&this->ComponentOrder,(long)(int)mi._M_node._4_4_);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<int,_cmComputeLinkDepends::PendingComponent,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::PendingComponent>_>_>
       ::find(&this->PendingComponents,__x);
  pc = (PendingComponent *)
       std::
       map<int,_cmComputeLinkDepends::PendingComponent,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::PendingComponent>_>_>
       ::end(&this->PendingComponents);
  bVar1 = std::operator!=(&local_28,(_Self *)&pc);
  if (bVar1) {
    ppVar5 = std::_Rb_tree_iterator<std::pair<const_int,_cmComputeLinkDepends::PendingComponent>_>::
             operator->(&local_28);
    std::set<int,_std::less<int>,_std::allocator<int>_>::erase(&(ppVar5->second).Entries,&component)
    ;
    bVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::empty(&(ppVar5->second).Entries);
    if (bVar1) {
      (ppVar5->second).Count = (ppVar5->second).Count + -1;
      if ((ppVar5->second).Count == 0) {
        std::
        map<int,cmComputeLinkDepends::PendingComponent,std::less<int>,std::allocator<std::pair<int_const,cmComputeLinkDepends::PendingComponent>>>
        ::erase_abi_cxx11_((map<int,cmComputeLinkDepends::PendingComponent,std::less<int>,std::allocator<std::pair<int_const,cmComputeLinkDepends::PendingComponent>>>
                            *)&this->PendingComponents,(iterator)local_28._M_node);
        bVar2 = true;
      }
      else {
        pvVar3 = &cmComputeComponentGraph::GetComponent(this->CCG,mi._M_node._4_4_)->
                  super_vector<int,_std::allocator<int>_>;
        sVar6 = std::vector<int,_std::allocator<int>_>::size(pvVar3);
        if (sVar6 < 2) {
          __assert_fail("nl.size() > 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmComputeLinkDepends.cxx"
                        ,0x2ef,"void cmComputeLinkDepends::VisitEntry(int)");
        }
        __first = std::vector<int,_std::allocator<int>_>::begin(pvVar3);
        __last = std::vector<int,_std::allocator<int>_>::end(pvVar3);
        std::set<int,std::less<int>,std::allocator<int>>::
        insert<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                  ((set<int,std::less<int>,std::allocator<int>> *)&(ppVar5->second).Entries,
                   (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                   __first._M_current,
                   (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                   __last._M_current);
      }
    }
  }
  else {
    pvVar3 = &cmComputeComponentGraph::GetComponent(this->CCG,mi._M_node._4_4_)->
              super_vector<int,_std::allocator<int>_>;
    sVar6 = std::vector<int,_std::allocator<int>_>::size(pvVar3);
    bVar2 = sVar6 < 2;
    if (!bVar2) {
      pPVar7 = MakePendingComponent(this,mi._M_node._4_4_);
      std::set<int,_std::less<int>,_std::allocator<int>_>::erase(&pPVar7->Entries,&component);
    }
  }
  if (bVar2) {
    oi._M_current =
         (cmGraphEdge *)cmComputeComponentGraph::GetComponentGraphEdges(this->CCG,mi._M_node._4_4_);
    local_80._M_current =
         (cmGraphEdge *)
         std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::begin
                   ((vector<cmGraphEdge,_std::allocator<cmGraphEdge>_> *)oi._M_current);
    while( true ) {
      local_88._M_current =
           (cmGraphEdge *)std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::end(oi._M_current)
      ;
      bVar2 = __gnu_cxx::operator!=(&local_80,&local_88);
      if (!bVar2) break;
      this_00 = __gnu_cxx::
                __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
                ::operator*(&local_80);
      component_00 = cmGraphEdge::operator_cast_to_int(this_00);
      MakePendingComponent(this,component_00);
      __gnu_cxx::
      __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
      ::operator++(&local_80);
    }
  }
  return;
}

Assistant:

void cmComputeLinkDepends::VisitEntry(int index)
{
  // Include this entry on the link line.
  this->FinalLinkOrder.push_back(index);

  // This entry has now been seen.  Update its component.
  bool completed = false;
  int component = this->CCG->GetComponentMap()[index];
  std::map<int, PendingComponent>::iterator mi =
    this->PendingComponents.find(this->ComponentOrder[component]);
  if (mi != this->PendingComponents.end()) {
    // The entry is in an already pending component.
    PendingComponent& pc = mi->second;

    // Remove the entry from those pending in its component.
    pc.Entries.erase(index);
    if (pc.Entries.empty()) {
      // The complete component has been seen since it was last needed.
      --pc.Count;

      if (pc.Count == 0) {
        // The component has been completed.
        this->PendingComponents.erase(mi);
        completed = true;
      } else {
        // The whole component needs to be seen again.
        NodeList const& nl = this->CCG->GetComponent(component);
        assert(nl.size() > 1);
        pc.Entries.insert(nl.begin(), nl.end());
      }
    }
  } else {
    // The entry is not in an already pending component.
    NodeList const& nl = this->CCG->GetComponent(component);
    if (nl.size() > 1) {
      // This is a non-trivial component.  It is now pending.
      PendingComponent& pc = this->MakePendingComponent(component);

      // The starting entry has already been seen.
      pc.Entries.erase(index);
    } else {
      // This is a trivial component, so it is already complete.
      completed = true;
    }
  }

  // If the entry completed a component, the component's dependencies
  // are now pending.
  if (completed) {
    EdgeList const& ol = this->CCG->GetComponentGraphEdges(component);
    for (EdgeList::const_iterator oi = ol.begin(); oi != ol.end(); ++oi) {
      // This entire component is now pending no matter whether it has
      // been partially seen already.
      this->MakePendingComponent(*oi);
    }
  }
}